

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blif_parser.cpp
# Opt level: O2

string * __thiscall Terms::toString_abi_cxx11_(string *__return_storage_ptr__,Terms *this)

{
  Node *this_00;
  pointer pNVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  this_00 = (this->_terms).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_start;
  pNVar1 = (this->_terms).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  Node::nodeWithNegate_abi_cxx11_(&local_48,this_00);
  std::
  accumulate<__gnu_cxx::__normal_iterator<Node*,std::vector<Node,std::allocator<Node>>>,std::__cxx11::string,Terms::toString()::_lambda(std::__cxx11::string_const&,Node_const&)_1_>
            (__return_storage_ptr__,this_00 + 1,pNVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (this->_negate == true) {
    std::operator+(&bStack_88,"(",__return_storage_ptr__);
    std::operator+(&local_68,&bStack_88,")\'");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&bStack_88);
  }
  return __return_storage_ptr__;
}

Assistant:

string toString() {
    string terms = accumulate(next(begin(this->_terms)), end(this->_terms), this->_terms.begin()->nodeWithNegate(),
      [] (const string& s, const Node& i) {
        return s + " " + i.nodeWithNegate();
      });
    
    if (this->_negate) {
      terms = "(" + terms + ")'";
    }

    return terms;
  }